

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototypeNoLock
          (DynamicMessageFactory *this,Descriptor *type)

{
  _Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_true,_std::tr1::_Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>_>
  *this_00;
  int *piVar1;
  GeneratedMessageReflection *pGVar2;
  int iVar3;
  DescriptorPool *pDVar4;
  mapped_type *ppTVar5;
  mapped_type pTVar6;
  DescriptorPool *pDVar7;
  int *piVar8;
  MessageFactory *pMVar9;
  undefined4 extraout_var;
  LogMessage *other;
  DynamicMessage *this_01;
  GeneratedMessageReflection *this_02;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  Descriptor *pDVar18;
  LogFinisher local_81;
  Descriptor *type_local;
  mapped_type local_78;
  DynamicMessageFactory *local_70;
  LogMessage local_68;
  
  type_local = type;
  if (this->delegate_to_generated_factory_ == true) {
    pDVar7 = *(DescriptorPool **)(*(long *)(type + 0x10) + 0x10);
    pDVar4 = DescriptorPool::generated_pool();
    if (pDVar7 == pDVar4) {
      pMVar9 = MessageFactory::generated_factory();
      iVar3 = (*pMVar9->_vptr_MessageFactory[2])(pMVar9,type);
      return (Message *)CONCAT44(extraout_var,iVar3);
    }
  }
  this_00 = (_Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_true,_std::tr1::_Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>_>
             *)(this->prototypes_).ptr_;
  if (this_00 ==
      (_Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_true,_std::tr1::_Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>_>
       *)0x0) {
    __assert_fail("ptr_ != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/stubs/common.h"
                  ,0x1e3,
                  "C *google::protobuf::internal::scoped_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap>::operator->() const [C = google::protobuf::DynamicMessageFactory::PrototypeMap]"
                 );
  }
  ppTVar5 = std::tr1::__detail::
            _Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_true,_std::tr1::_Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>_>
            ::operator[](this_00,&type_local);
  if (*ppTVar5 == (mapped_type)0x0) {
    pTVar6 = (mapped_type)operator_new(0x40);
    pDVar18 = type_local;
    (pTVar6->offsets).array_ = (int *)0x0;
    (pTVar6->reflection).ptr_ = (GeneratedMessageReflection *)0x0;
    pTVar6->prototype = (DynamicMessage *)0x0;
    *ppTVar5 = pTVar6;
    pTVar6->type = type_local;
    pDVar7 = this->pool_;
    if (pDVar7 == (DescriptorPool *)0x0) {
      pDVar7 = *(DescriptorPool **)(*(long *)(type_local + 0x10) + 0x10);
    }
    pTVar6->pool = pDVar7;
    pTVar6->factory = this;
    uVar14 = 0xffffffffffffffff;
    if (-1 < (long)*(int *)(type_local + 0x2c)) {
      uVar14 = (long)*(int *)(type_local + 0x2c) * 4;
    }
    piVar8 = (int *)operator_new__(uVar14);
    piVar1 = (pTVar6->offsets).array_;
    local_70 = this;
    if (piVar1 != piVar8) {
      if (piVar1 != (int *)0x0) {
        operator_delete__(piVar1);
        pDVar18 = type_local;
      }
      (pTVar6->offsets).array_ = piVar8;
    }
    pTVar6->has_bits_offset = 0x18;
    iVar3 = *(int *)(pDVar18 + 0x2c);
    iVar11 = iVar3 + 0x3e;
    if (-1 < iVar3 + 0x1f) {
      iVar11 = iVar3 + 0x1f;
    }
    uVar17 = (iVar11 >> 5) * 4 + 0x1f;
    uVar15 = (iVar11 >> 5) * 4 + 0x26;
    if (-1 < (int)uVar17) {
      uVar15 = uVar17;
    }
    uVar15 = uVar15 & 0xfffffff8;
    if (*(int *)(pDVar18 + 0x58) < 1) {
      uVar10 = 0xffffffff;
      uVar17 = uVar15;
    }
    else {
      uVar17 = uVar15 + 0x3e;
      if (-1 < (int)(uVar15 + 0x37)) {
        uVar17 = uVar15 + 0x37;
      }
      uVar17 = uVar17 & 0xfffffff8;
      uVar10 = uVar15;
    }
    pTVar6->extensions_offset = uVar10;
    local_78 = pTVar6;
    if (0 < iVar3) {
      lVar13 = 0xc;
      lVar12 = 0;
      do {
        uVar15 = *(uint *)(FieldDescriptor::kTypeToCppTypeMap +
                          (ulong)*(uint *)(*(long *)(pDVar18 + 0x30) + -4 + lVar13 * 4) * 4);
        if (*(int *)(*(long *)(pDVar18 + 0x30) + lVar13 * 4) == 3) {
          iVar11 = 8;
          iVar3 = 0x10;
          if (7 < uVar15 - 1) {
            if ((uVar15 != 9) && (uVar15 != 10)) goto LAB_001a14e0;
            iVar3 = 0x18;
          }
        }
        else if (uVar15 < 0xb) {
          if ((0x634U >> (uVar15 & 0x1f) & 1) == 0) {
            iVar3 = 4;
            if ((0x14aU >> (uVar15 & 0x1f) & 1) == 0) {
              if (uVar15 != 7) goto LAB_001a14e0;
              iVar3 = 1;
              iVar11 = 1;
            }
            else {
              iVar11 = 4;
            }
          }
          else {
            iVar3 = 8;
            iVar11 = 8;
          }
        }
        else {
LAB_001a14e0:
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/dynamic_message.cc"
                     ,0x8c);
          other = internal::LogMessage::operator<<(&local_68,"Can\'t get here.");
          internal::LogFinisher::operator=(&local_81,other);
          internal::LogMessage::~LogMessage(&local_68);
          iVar3 = 0;
          iVar11 = 0;
          pDVar18 = type_local;
        }
        iVar16 = uVar17 + iVar11 + -1;
        iVar16 = iVar16 - iVar16 % iVar11;
        piVar8[lVar12] = iVar16;
        uVar17 = iVar16 + iVar3;
        lVar12 = lVar12 + 1;
        lVar13 = lVar13 + 0x1e;
      } while (lVar12 < *(int *)(pDVar18 + 0x2c));
    }
    pTVar6 = local_78;
    uVar15 = uVar17 + 0xe;
    if (-1 < (int)(uVar17 + 7)) {
      uVar15 = uVar17 + 7;
    }
    uVar15 = uVar15 & 0xfffffff8;
    local_78->unknown_fields_offset = uVar15;
    uVar17 = uVar15 + 0x16;
    if (-1 < (int)(uVar15 + 0xf)) {
      uVar17 = uVar15 + 0xf;
    }
    uVar17 = uVar17 & 0xfffffff8;
    local_78->size = uVar17;
    this_01 = (DynamicMessage *)operator_new((long)(int)uVar17);
    memset(this_01,0,(long)(int)uVar17);
    DynamicMessage::DynamicMessage(this_01,pTVar6);
    pTVar6->prototype = this_01;
    this_02 = (GeneratedMessageReflection *)operator_new(0x40);
    internal::GeneratedMessageReflection::GeneratedMessageReflection
              (this_02,pTVar6->type,(Message *)this_01,(pTVar6->offsets).array_,
               pTVar6->has_bits_offset,pTVar6->unknown_fields_offset,pTVar6->extensions_offset,
               pTVar6->pool,&local_70->super_MessageFactory,pTVar6->size);
    pGVar2 = (pTVar6->reflection).ptr_;
    if (pGVar2 != this_02) {
      if (pGVar2 != (GeneratedMessageReflection *)0x0) {
        (*(pGVar2->super_Reflection)._vptr_Reflection[1])();
      }
      (pTVar6->reflection).ptr_ = this_02;
    }
    DynamicMessage::CrossLinkPrototypes(this_01);
  }
  else {
    this_01 = (*ppTVar5)->prototype;
  }
  return &this_01->super_Message;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototypeNoLock(
    const Descriptor* type) {
  if (delegate_to_generated_factory_ &&
      type->file()->pool() == DescriptorPool::generated_pool()) {
    return MessageFactory::generated_factory()->GetPrototype(type);
  }

  const DynamicMessage::TypeInfo** target = &prototypes_->map_[type];
  if (*target != NULL) {
    // Already exists.
    return (*target)->prototype;
  }

  DynamicMessage::TypeInfo* type_info = new DynamicMessage::TypeInfo;
  *target = type_info;

  type_info->type = type;
  type_info->pool = (pool_ == NULL) ? type->file()->pool() : pool_;
  type_info->factory = this;

  // We need to construct all the structures passed to
  // GeneratedMessageReflection's constructor.  This includes:
  // - A block of memory that contains space for all the message's fields.
  // - An array of integers indicating the byte offset of each field within
  //   this block.
  // - A big bitfield containing a bit for each field indicating whether
  //   or not that field is set.

  // Compute size and offsets.
  int* offsets = new int[type->field_count()];
  type_info->offsets.reset(offsets);

  // Decide all field offsets by packing in order.
  // We place the DynamicMessage object itself at the beginning of the allocated
  // space.
  int size = sizeof(DynamicMessage);
  size = AlignOffset(size);

  // Next the has_bits, which is an array of uint32s.
  type_info->has_bits_offset = size;
  int has_bits_array_size =
    DivideRoundingUp(type->field_count(), bitsizeof(uint32));
  size += has_bits_array_size * sizeof(uint32);
  size = AlignOffset(size);

  // The ExtensionSet, if any.
  if (type->extension_range_count() > 0) {
    type_info->extensions_offset = size;
    size += sizeof(ExtensionSet);
    size = AlignOffset(size);
  } else {
    // No extensions.
    type_info->extensions_offset = -1;
  }

  // All the fields.
  for (int i = 0; i < type->field_count(); i++) {
    // Make sure field is aligned to avoid bus errors.
    int field_size = FieldSpaceUsed(type->field(i));
    size = AlignTo(size, min(kSafeAlignment, field_size));
    offsets[i] = size;
    size += field_size;
  }

  // Add the UnknownFieldSet to the end.
  size = AlignOffset(size);
  type_info->unknown_fields_offset = size;
  size += sizeof(UnknownFieldSet);

  // Align the final size to make sure no clever allocators think that
  // alignment is not necessary.
  size = AlignOffset(size);
  type_info->size = size;

  // Allocate the prototype.
  void* base = operator new(size);
  memset(base, 0, size);
  DynamicMessage* prototype = new(base) DynamicMessage(type_info);
  type_info->prototype = prototype;

  // Construct the reflection object.
  type_info->reflection.reset(
    new GeneratedMessageReflection(
      type_info->type,
      type_info->prototype,
      type_info->offsets.get(),
      type_info->has_bits_offset,
      type_info->unknown_fields_offset,
      type_info->extensions_offset,
      type_info->pool,
      this,
      type_info->size));

  // Cross link prototypes.
  prototype->CrossLinkPrototypes();

  return prototype;
}